

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall CVmRun::inh_prop(CVmRun *this,uint caller_ofs,vm_prop_id_t prop,uint argc)

{
  vm_obj_id_t vVar1;
  vm_obj_id_t vVar2;
  int iVar3;
  CVmObject *pCVar4;
  uchar *puVar5;
  int in_ECX;
  undefined2 in_DX;
  vm_rcdesc *unaff_RBX;
  uint in_EDI;
  vm_obj_id_t self;
  int found;
  vm_obj_id_t srcobj;
  vm_val_t val;
  vm_obj_id_t defining_obj;
  vm_val_t orig_target_obj;
  vm_prop_id_t prop_00;
  CVmRun *this_00;
  vm_obj_id_t in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  vm_val_t local_30;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe8;
  vm_obj_id_t defining_obj_00;
  
  defining_obj_00 = CONCAT22(in_DX,in_stack_ffffffffffffffe8);
  vVar1 = get_defining_obj();
  vVar2 = get_orig_target_obj();
  vm_val_t::set_obj(&local_30,vVar2);
  vVar2 = get_self();
  pCVar4 = vm_objp(0);
  iVar3 = (*pCVar4->_vptr_CVmObject[0xf])
                    (pCVar4,(ulong)(ushort)(defining_obj_00 >> 0x10),&stack0xffffffffffffffb8,
                     (ulong)vVar2,(ulong)local_30.val.obj,(ulong)vVar1,&stack0xffffffffffffffb4,
                     &stack0xffffffffffffffe4);
  if ((iVar3 == 0) && (G_predef_X.prop_not_defined_prop != 0)) {
    pCVar4 = vm_objp(0);
    prop_00 = (vm_prop_id_t)((ulong)&stack0xffffffffffffffb4 >> 0x30);
    this_00 = (CVmRun *)&stack0xffffffffffffffe4;
    iVar3 = (*pCVar4->_vptr_CVmObject[0xf])
                      (pCVar4,(ulong)G_predef_X.prop_not_defined_prop,&stack0xffffffffffffffb8,
                       (ulong)vVar2,(ulong)local_30.val.obj,(ulong)vVar1);
    if ((iVar3 != 0) &&
       (((in_stack_ffffffffffffffb8 == 0xb || (in_stack_ffffffffffffffb8 == 0x11)) ||
        (in_stack_ffffffffffffffb8 == 0x12)))) {
      push_prop(this_00,prop_00);
      in_ECX = in_ECX + 1;
      defining_obj_00 = CONCAT22(G_predef_X.prop_not_defined_prop,(short)defining_obj_00);
    }
  }
  puVar5 = eval_prop_val((CVmRun *)CONCAT44(vVar1,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                         (vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb4,(vm_prop_id_t)((uint)iVar3 >> 0x10),
                         (vm_val_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),defining_obj_00,
                         in_EDI,unaff_RBX);
  return puVar5;
}

Assistant:

const uchar *CVmRun::inh_prop(VMG_ uint caller_ofs,
                              vm_prop_id_t prop, uint argc)
{
    vm_val_t orig_target_obj;
    vm_obj_id_t defining_obj;
    vm_val_t val;
    vm_obj_id_t srcobj;
    int found;
    vm_obj_id_t self;

    /* get the defining object from the stack frame */
    defining_obj = get_defining_obj(vmg0_);

    /* get the original target object from the stack frame */
    orig_target_obj.set_obj(get_orig_target_obj(vmg0_));

    /* get the 'self' object */
    self = get_self(vmg0_);

    /* get the inherited property value */
    found = vm_objp(vmg_ self)->inh_prop(vmg_ prop, &val, self,
                                         orig_target_obj.val.obj,
                                         defining_obj, &srcobj, &argc);

    /* if we didn't find it, try inheriting propNotDefined */
    if (!found && G_predef->prop_not_defined_prop != VM_INVALID_PROP)
    {
        /* 
         *   Look up propNotDefined using the same search conditions we used
         *   to find the original inherited property.  This lets us look up
         *   the "inherited" propNotDefined.  
         */
        found = vm_objp(vmg_ self)->inh_prop(vmg_
                                             G_predef->prop_not_defined_prop,
                                             &val, self,
                                             orig_target_obj.val.obj,
                                             defining_obj, &srcobj, &argc);

        /* 
         *   if we found it, and it's code, push the original property ID we
         *   were attempting to inherit - this becomes the new first
         *   parameter to the propNotDefined method 
         */
        if (found
            && (val.typ == VM_CODEOFS
                || val.typ == VM_OBJX
                || val.typ == VM_BIFPTRX))
        {
            /* add the original property pointer argument */
            push_prop(vmg_ prop);

            /* count the additional argument */
            ++argc;

            /* the target property changes to propNotDefined */
            prop = G_predef->prop_not_defined_prop;
        }
    }

    /* 
     *   evaluate and store the result - note that "self" remains the
     *   current "self" object, since we're inheriting within the context
     *   of the original method call 
     */
    return eval_prop_val(vmg_ found, caller_ofs, &val, self, prop,
                         &orig_target_obj, srcobj, argc, 0);
}